

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O2

void __thiscall HTTPWorkItem::operator()(HTTPWorkItem *this)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    std::
    function<bool_(HTTPRequest_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(&this->func,
                 (this->req)._M_t.
                 super___uniq_ptr_impl<HTTPRequest,_std::default_delete<HTTPRequest>_>._M_t.
                 super__Tuple_impl<0UL,_HTTPRequest_*,_std::default_delete<HTTPRequest>_>.
                 super__Head_base<0UL,_HTTPRequest_*,_false>._M_head_impl,&this->path);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void operator()() override
    {
        func(req.get(), path);
    }